

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
NLReaderTest_InvalidSegmentType_Test::TestBody(NLReaderTest_InvalidSegmentType_Test *this)

{
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  char *pcVar4;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100 [2];
  long local_f0 [2];
  AssertionResult local_e0;
  AssertionResult local_d0;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  testing::AssertionSuccess();
  if ((string)local_d0.success_ == (string)0x1) {
    local_100[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"(input):17:1: invalid segment type","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"?","");
      ReadNL(&local_50,&local_90,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_d0,
               (char (*) [90])
               "Expected: ReadNL(\"?\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if (local_100[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0) {
      operator_delete(local_100[0].ptr_,local_f0[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_100);
  if (local_d0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((local_d0.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5a0,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)local_100);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
  if (local_100[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_100[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_100[0].ptr_ + 8))();
    }
    local_100[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  testing::AssertionSuccess();
  if (local_e0.success_ == true) {
    local_100[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"(input):19:1: invalid segment type","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_d0._0_8_ = (AssertHelperData *)local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"C0\nn4.2\n","");
      plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                                 ((ulong)&local_d0,(ulong)local_d0.message_.ptr_,0,'\x01');
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_b0.field_2._M_allocated_capacity = *psVar3;
        local_b0.field_2._8_8_ = plVar2[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar3;
        local_b0._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_b0._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      ReadNL(&local_70,&local_b0,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((AssertHelperData *)local_d0._0_8_ != (AssertHelperData *)local_c0) {
        operator_delete((void *)local_d0._0_8_,local_c0._0_8_ + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_e0,
               (char (*) [119])
               "Expected: ReadNL(std::string(\"C0\\nn4.2\\n\") + \'\\0\') throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if (local_100[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0) {
      operator_delete(local_100[0].ptr_,local_f0[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_100);
  if (local_e0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((local_e0.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5a2,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_100);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
  if (local_100[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_100[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_100[0].ptr_ + 8))();
    }
    local_100[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(NLReaderTest, InvalidSegmentType) {
  EXPECT_READ_ERROR("?", "(input):17:1: invalid segment type");
  EXPECT_READ_ERROR(std::string("C0\nn4.2\n") + '\0',
                    "(input):19:1: invalid segment type");
}